

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::getp_getClockTime(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int32_t *piVar1;
  int iVar2;
  CVmTimeZone *this_00;
  uint argc;
  int32_t daytime;
  int32_t dayno;
  int32_t ofs;
  int local_2c;
  int32_t local_28;
  int32_t local_24;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getClockTime(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getClockTime();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getClockTime::desc);
  if (iVar2 == 0) {
    this_00 = get_tz_arg(0,argc);
    piVar1 = (int32_t *)(this->super_CVmObject).ext_;
    local_28 = *piVar1;
    local_2c = piVar1[1];
    CVmTimeZone::utc_to_local(this_00,&local_28,&local_2c,&local_24);
    make_int_list(retval,4,(ulong)(uint)(local_2c / 3600000),
                  (ulong)(uint)((local_2c / 60000) % 0x3c),(ulong)(uint)((local_2c / 1000) % 0x3c),
                  (ulong)(uint)(local_2c % 1000));
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getClockTime(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date and time in local time */
    int32_t dayno, daytime;
    get_local_time(dayno, daytime, get_tz_arg(vmg_ 0, argc));

    /* return [hour, minute, second, msec] */
    make_int_list(vmg_ retval, 4,
                  daytime/(60*60*1000),
                  daytime/(60*1000) % 60,
                  daytime/(1000) % 60,
                  daytime % 1000);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}